

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

void __thiscall
icu_63::ServiceEnumeration::ServiceEnumeration
          (ServiceEnumeration *this,ServiceEnumeration *other,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  long *plVar3;
  void *obj;
  int32_t local_30;
  int32_t length;
  int32_t i;
  UErrorCode *status_local;
  ServiceEnumeration *other_local;
  ServiceEnumeration *this_local;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__ServiceEnumeration_004a3300;
  this->_service = other->_service;
  this->_timestamp = other->_timestamp;
  UVector::UVector(&this->_ids,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,status);
  this->_pos = 0;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    iVar2 = UVector::size(&other->_ids);
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      plVar3 = (long *)UVector::elementAt(&other->_ids,local_30);
      obj = (void *)(**(code **)(*plVar3 + 0x38))();
      UVector::addElement(&this->_ids,obj,status);
    }
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      this->_pos = other->_pos;
    }
  }
  return;
}

Assistant:

ServiceEnumeration(const ServiceEnumeration &other, UErrorCode &status)
        : _service(other._service)
        , _timestamp(other._timestamp)
        , _ids(uprv_deleteUObject, NULL, status)
        , _pos(0)
    {
        if(U_SUCCESS(status)) {
            int32_t i, length;

            length = other._ids.size();
            for(i = 0; i < length; ++i) {
                _ids.addElement(((UnicodeString *)other._ids.elementAt(i))->clone(), status);
            }

            if(U_SUCCESS(status)) {
                _pos = other._pos;
            }
        }
    }